

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> luna::Parse(Lexer *lexer)

{
  _Head_base<0UL,_luna::SyntaxTree_*,_false> in_RDI;
  ParserImpl impl;
  _Head_base<0UL,_luna::SyntaxTree_*,_false> _Var1;
  
  _Var1._M_head_impl = in_RDI._M_head_impl;
  anon_unknown.dwarf_58494::ParserImpl::ParserImpl
            ((ParserImpl *)in_RDI._M_head_impl,(Lexer *)in_RDI._M_head_impl);
  anon_unknown.dwarf_58494::ParserImpl::Parse((ParserImpl *)in_RDI._M_head_impl);
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)_Var1._M_head_impl;
}

Assistant:

std::unique_ptr<SyntaxTree> Parse(Lexer *lexer)
    {
        ParserImpl impl(lexer);
        return impl.Parse();
    }